

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_frame_size_with_refs(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  AV1_COMMON *cm_00;
  AV1_COMMON *in_RSI;
  long in_RDI;
  int frame_size_override;
  AV1_COMMON *unaff_retaddr;
  YV12_BUFFER_CONFIG *cfg;
  MV_REFERENCE_FRAME ref_frame;
  int found;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  undefined4 in_stack_ffffffffffffffdc;
  char local_15;
  uint bit;
  
  bit = 0;
  local_15 = '\x01';
  do {
    if ('\a' < local_15) {
LAB_001e5222:
      if (bit == 0) {
        write_frame_size(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(aom_write_bit_buffer *)in_RSI);
      }
      return;
    }
    cm_00 = (AV1_COMMON *)get_ref_frame_yv12_buf(in_RSI,(MV_REFERENCE_FRAME)(bit >> 0x18));
    if (cm_00 != (AV1_COMMON *)0x0) {
      in_stack_ffffffffffffffdb = false;
      if (*(int *)(in_RDI + 0x48) ==
          (((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)
           ((anon_union_8_2_2fc10223_for_yv12_buffer_config_0 *)&cm_00->current_frame + 2))->field_0
          ).y_crop_width) {
        in_stack_ffffffffffffffdb =
             *(int *)(in_RDI + 0x4c) ==
             (((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)
              ((anon_union_8_2_2fc10223_for_yv12_buffer_config_0 *)&cm_00->current_frame + 3))->
             field_0).y_crop_height;
      }
      in_stack_ffffffffffffffda = false;
      if (*(uint32_t *)(in_RDI + 0x40) == cm_00->buffer_removal_times[0x18]) {
        in_stack_ffffffffffffffda =
             *(uint32_t *)(in_RDI + 0x44) == cm_00->buffer_removal_times[0x19];
      }
      bit = (uint)(byte)(in_stack_ffffffffffffffda & in_stack_ffffffffffffffdb);
    }
    aom_wb_write_bit((aom_write_bit_buffer *)in_RSI,bit);
    if (bit != 0) {
      write_superres_scale
                (cm_00,(aom_write_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT13(in_stack_ffffffffffffffdb,
                                         CONCAT12(in_stack_ffffffffffffffda,
                                                  in_stack_ffffffffffffffd8))));
      goto LAB_001e5222;
    }
    local_15 = local_15 + '\x01';
  } while( true );
}

Assistant:

static inline void write_frame_size_with_refs(const AV1_COMMON *const cm,
                                              struct aom_write_bit_buffer *wb) {
  int found = 0;

  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const YV12_BUFFER_CONFIG *cfg = get_ref_frame_yv12_buf(cm, ref_frame);

    if (cfg != NULL) {
      found = cm->superres_upscaled_width == cfg->y_crop_width &&
              cm->superres_upscaled_height == cfg->y_crop_height;
      found &= cm->render_width == cfg->render_width &&
               cm->render_height == cfg->render_height;
    }
    aom_wb_write_bit(wb, found);
    if (found) {
      write_superres_scale(cm, wb);
      break;
    }
  }

  if (!found) {
    int frame_size_override = 1;  // Always equal to 1 in this function
    write_frame_size(cm, frame_size_override, wb);
  }
}